

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.H
# Opt level: O2

Array<int,_3> __thiscall amrex::Geometry::setPeriodicity(Geometry *this,Array<int,_3> *period)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  Array<int,_3> AVar4;
  
  bVar1 = (this->super_CoordSys).field_0x51;
  bVar2 = (this->super_CoordSys).field_0x52;
  uVar3 = (this->super_CoordSys).field_0x53;
  (this->super_CoordSys).field_0x51 = period->_M_elems[0] != 0;
  (this->super_CoordSys).field_0x52 = period->_M_elems[1] != 0;
  (this->super_CoordSys).field_0x53 = period->_M_elems[2] != 0;
  AVar4._M_elems._0_8_ = (ulong)bVar2 << 0x20 | (ulong)bVar1;
  AVar4._M_elems[2]._0_1_ = uVar3;
  AVar4._M_elems[2]._1_3_ = 0;
  return (Array<int,_3>)AVar4._M_elems;
}

Assistant:

Array<int,AMREX_SPACEDIM>
    setPeriodicity (Array<int,AMREX_SPACEDIM> const& period) noexcept {
        Array<int,AMREX_SPACEDIM> r{{AMREX_D_DECL(is_periodic[0],
                                                  is_periodic[1],
                                                  is_periodic[2])}};
        AMREX_D_TERM(is_periodic[0] = period[0];,
                     is_periodic[1] = period[1];,
                     is_periodic[2] = period[2];);
        return r;
    }